

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O3

void writeKeys(string *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  size_t __val;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  char cVar9;
  size_type sVar10;
  char cVar11;
  unsigned_long uVar12;
  string *key;
  pointer pbVar13;
  int *val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  int *piVar15;
  string *__range2;
  ulong uVar16;
  string __str;
  size_t num_chars;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  vector<int,_std::allocator<int>_> *__range1;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  long *local_a8;
  uint local_a0;
  long local_98 [2];
  unsigned_long local_88;
  size_t local_80;
  void *local_78;
  iterator iStack_70;
  unsigned_long *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_88 = 0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_68 = (unsigned_long *)0x0;
  local_78 = (void *)0x0;
  iStack_70._M_current = (unsigned_long *)0x0;
  pbVar13 = (keys->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = n;
  local_38 = mapping;
  if (pbVar13 == pbVar1) {
    cVar9 = '\x01';
    pvVar14 = keys;
  }
  else {
    local_b0 = keys;
    do {
      if (iStack_70._M_current == local_68) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,iStack_70,
                   &local_88);
      }
      else {
        *iStack_70._M_current = local_88;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      local_f0 = (long *)pbVar13->_M_string_length;
      local_88 = local_88 + (long)local_f0;
      if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_f0);
      }
      else {
        *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_f0;
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar1);
    cVar9 = '\x01';
    pvVar14 = local_b0;
    if (9 < local_88) {
      uVar12 = local_88;
      cVar11 = '\x04';
      do {
        cVar9 = cVar11;
        if (uVar12 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_0010486c;
        }
        if (uVar12 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_0010486c;
        }
        if (uVar12 < 10000) goto LAB_0010486c;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar11 = cVar9 + '\x04';
      } while (bVar3);
      cVar9 = cVar9 + '\x01';
    }
  }
LAB_0010486c:
  uVar12 = local_88;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,uVar12);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1160f0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0 = &local_e0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  pbVar1 = (pvVar14->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
      pbVar13 = pbVar13 + 1) {
    cVar9 = '\b';
    do {
      cVar11 = (char)str;
      std::__cxx11::string::push_back(cVar11);
      cVar9 = cVar9 + -1;
    } while (cVar9 != '\0');
    sVar2 = pbVar13->_M_string_length;
    if (sVar2 != 0) {
      sVar10 = 0;
      do {
        std::__cxx11::string::push_back(cVar11);
        std::__cxx11::string::push_back(cVar11);
        std::__cxx11::string::push_back(cVar11);
        std::__cxx11::string::push_back(cVar11);
        sVar10 = sVar10 + 1;
      } while (sVar2 != sVar10);
    }
    std::__cxx11::string::push_back(cVar11);
  }
  std::__cxx11::string::append((char *)str);
  uVar16 = local_80 + 1;
  cVar9 = '\x01';
  if (9 < uVar16) {
    uVar6 = uVar16;
    cVar11 = '\x04';
    do {
      cVar9 = cVar11;
      if (uVar6 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00104b09;
      }
      if (uVar6 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00104b09;
      }
      if (uVar6 < 10000) goto LAB_00104b09;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar11 = cVar9 + '\x04';
    } while (bVar3);
    cVar9 = cVar9 + '\x01';
  }
LAB_00104b09:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,uVar16);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x116126);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0 = &local_e0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  local_80 = uVar16;
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  piVar15 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)piVar15 != local_b0) {
    uVar16 = 0;
    do {
      if ((uVar16 != 0) && (uVar16 == (uVar16 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)str);
      }
      if ((long)*piVar15 == -1) {
        std::__cxx11::string::append((char *)str);
      }
      else {
        uVar6 = *(ulong *)((long)local_78 + (long)*piVar15 * 8);
        cVar9 = '\x01';
        if (9 < uVar6) {
          uVar8 = uVar6;
          cVar11 = '\x04';
          do {
            cVar9 = cVar11;
            if (uVar8 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_00104d30;
            }
            if (uVar8 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_00104d30;
            }
            if (uVar8 < 10000) goto LAB_00104d30;
            bVar3 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar11 = cVar9 + '\x04';
          } while (bVar3);
          cVar9 = cVar9 + '\x01';
        }
LAB_00104d30:
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct((ulong)&local_d0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,uVar6);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_f0 = &local_e0;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_e0 = *plVar5;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar5;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)str,(ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
      }
      uVar16 = uVar16 + 1;
      piVar15 = piVar15 + 1;
    } while ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)piVar15 != local_b0);
  }
  std::__cxx11::string::append((char *)str);
  __val = local_80;
  cVar9 = '\x01';
  if (9 < local_80) {
    sVar7 = local_80;
    cVar11 = '\x04';
    do {
      cVar9 = cVar11;
      if (sVar7 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00104e76;
      }
      if (sVar7 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00104e76;
      }
      if (sVar7 < 10000) goto LAB_00104e76;
      bVar3 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar11 = cVar9 + '\x04';
    } while (bVar3);
    cVar9 = cVar9 + '\x01';
  }
LAB_00104e76:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x116126);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0 = &local_e0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  piVar15 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)piVar15 != local_b0) {
    uVar16 = 0;
    do {
      if ((uVar16 != 0) && (uVar16 == (uVar16 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)str);
      }
      if ((long)*piVar15 == -1) {
        std::__cxx11::string::append((char *)str);
      }
      else {
        uVar6 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar15];
        cVar9 = '\x01';
        if (9 < uVar6) {
          uVar8 = uVar6;
          cVar11 = '\x04';
          do {
            cVar9 = cVar11;
            if (uVar8 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_00105097;
            }
            if (uVar8 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_00105097;
            }
            if (uVar8 < 10000) goto LAB_00105097;
            bVar3 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar11 = cVar9 + '\x04';
          } while (bVar3);
          cVar9 = cVar9 + '\x01';
        }
LAB_00105097:
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct((ulong)&local_d0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,uVar6);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_f0 = &local_e0;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_e0 = *plVar5;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar5;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)str,(ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
      }
      uVar16 = uVar16 + 1;
      piVar15 = piVar15 + 1;
    } while ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)piVar15 != local_b0);
  }
  std::__cxx11::string::append((char *)str);
  std::__cxx11::string::append((char *)str);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<std::string>& keys,
               const std::vector<int>& mapping,
               size_t n){
    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& key : keys){
        start.push_back(num_chars);
        num_chars += key.size();
        sze.push_back(key.size());
    }

    str += "    static constexpr std::array<char, " + std::to_string(num_chars) + "> flat_keys {\n";
    for(const std::string& key : keys){
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        for(const char& ch : key){
            str.push_back('\'');
            str.push_back(ch);
            str.push_back('\'');
            str.push_back(',');
        }
        str.push_back('\n');
    }
    str += "    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static inline bool checkBin(const std::string& key, size_t bin) noexcept{\n"
           "        const auto& size = key_size[bin];\n"
           "        if(size != key.size()) return false;\n"
           "        const auto& start = key_start[bin];\n"
           "        for(size_t i = size-1; i < std::numeric_limits<size_t>::max(); i--)\n"
           "            if(key[i] != flat_keys[start+i]) return false;\n"
           "        return true;\n"
           "    }\n";
}